

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_release_flushed_items(filemgr *file,wal_flush_items *flush_items)

{
  bool bVar1;
  uint32_t uVar2;
  avl_node *paVar3;
  list_elem *e;
  wal_item *pwVar4;
  wal_flush_items *in_RSI;
  long in_RDI;
  list_elem *a_1;
  list *list_head;
  avl_node *a;
  avl_tree *tree;
  size_t shard_num;
  wal_item *item;
  size_t in_stack_ffffffffffffffb8;
  wal *in_stack_ffffffffffffffc0;
  avl_node **node;
  list_elem **shard_num_00;
  wal_flush_items *pwVar5;
  
  _wal_snap_mark_flushed(in_stack_ffffffffffffffc0);
  bVar1 = _wal_are_items_sorted(in_RSI);
  pwVar5 = in_RSI;
  if (bVar1) {
    while (paVar3 = avl_first(&in_RSI->tree), paVar3 != (avl_node *)0x0) {
      node = &paVar3[-5].right;
      avl_remove(&pwVar5->tree,(avl_node *)node);
      uVar2 = get_checksum(&in_stack_ffffffffffffffc0->flag,in_stack_ffffffffffffffb8);
      pwVar4 = (wal_item *)((ulong)uVar2 % *(ulong *)(*(long *)(in_RDI + 0x48) + 0x48));
      pthread_spin_lock((pthread_spinlock_t *)
                        (*(long *)(*(long *)(in_RDI + 0x48) + 0x38) + (long)pwVar4 * 0x18 + 0x10));
      _wal_release_items((filemgr *)&pwVar5->tree,(size_t)node,pwVar4);
      pthread_spin_unlock((pthread_spinlock_t *)
                          (*(long *)(*(long *)(in_RDI + 0x48) + 0x38) + (long)pwVar4 * 0x18 + 0x10))
      ;
    }
  }
  else {
    while (e = list_begin(&in_RSI->list), e != (list_elem *)0x0) {
      shard_num_00 = &e[-7].next;
      list_remove(&in_RSI->list,e);
      uVar2 = get_checksum((uint8_t *)e,in_stack_ffffffffffffffb8);
      pwVar4 = (wal_item *)((ulong)uVar2 % *(ulong *)(*(long *)(in_RDI + 0x48) + 0x48));
      pthread_spin_lock((pthread_spinlock_t *)
                        (*(long *)(*(long *)(in_RDI + 0x48) + 0x38) + (long)pwVar4 * 0x18 + 0x10));
      _wal_release_items((filemgr *)&pwVar5->tree,(size_t)shard_num_00,pwVar4);
      pthread_spin_unlock((pthread_spinlock_t *)
                          (*(long *)(*(long *)(in_RDI + 0x48) + 0x38) + (long)pwVar4 * 0x18 + 0x10))
      ;
    }
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_release_flushed_items(struct filemgr *file,
                                     union wal_flush_items *flush_items)
{
    struct wal_item *item;
    size_t shard_num;

    _wal_snap_mark_flushed(file->wal); // Read-write barrier: items are in trie

    if (_wal_are_items_sorted(flush_items)) {
        struct avl_tree *tree = &flush_items->tree;
        // scan and remove entries in the avl-tree
        while (1) {
            struct avl_node *a;
            if ((a = avl_first(tree)) == NULL) {
                break;
            }
            item = _get_entry(a, struct wal_item, avl_flush);
            avl_remove(tree, &item->avl_flush);

            // Grab the WAL key shard lock.
            shard_num = get_checksum((uint8_t*)item->header->key,
                                     item->header->keylen)
                                     % file->wal->num_shards;
            spin_lock(&file->wal->key_shards[shard_num].lock);

            _wal_release_items(file, shard_num, item);

            spin_unlock(&file->wal->key_shards[shard_num].lock);
        }
    } else {
        struct list *list_head = &flush_items->list;
        // scan and remove entries in the avl-tree
        while (1) {
            struct list_elem *a;
            if ((a = list_begin(list_head)) == NULL) {
                break;
            }
            item = _get_entry(a, struct wal_item, list_elem_flush);
            list_remove(list_head, &item->list_elem_flush);

            // Grab the WAL key shard lock.
            shard_num = get_checksum((uint8_t*)item->header->key,
                                     item->header->keylen)
                                     % file->wal->num_shards;
            spin_lock(&file->wal->key_shards[shard_num].lock);
            _wal_release_items(file, shard_num, item);
            spin_unlock(&file->wal->key_shards[shard_num].lock);
        }
    }

    return FDB_RESULT_SUCCESS;
}